

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::HelperInvocationDerivateCase::init
          (HelperInvocationDerivateCase *this,EVP_PKEY_CTX *ctx)

{
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
  data_00;
  bool bVar1;
  int iVar2;
  RenderContext *renderCtx_00;
  undefined4 extraout_var;
  ShaderProgram *pSVar3;
  RenderContext *renderCtx_01;
  ProgramSources *pPVar4;
  TestLog *pTVar5;
  TestError *this_00;
  MessageBuilder *pMVar6;
  FboHelper *this_01;
  ShaderProgram *in_stack_fffffffffffffb88;
  FboHelper *pFVar7;
  undefined8 in_stack_fffffffffffffb90;
  int local_404;
  DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper> local_3f1;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
  local_3f0;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
  *local_3e0;
  MessageBuilder local_3d0;
  DefaultDeleter<glu::ShaderProgram> local_24b;
  undefined1 local_24a;
  allocator<char> local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  ShaderSource local_1e8;
  allocator<char> local_1b9;
  string local_1b8;
  ShaderSource local_198;
  ProgramSources local_170;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_a0;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *local_90;
  byte local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string funcSource;
  int actualSamples;
  int maxSamples;
  Functions *gl;
  RenderContext *renderCtx;
  HelperInvocationDerivateCase *this_local;
  
  renderCtx_00 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*renderCtx_00->_vptr_RenderContext[3])();
  funcSource.field_2._12_4_ = getInteger((Functions *)CONCAT44(extraout_var,iVar2),0x8d57);
  local_404 = funcSource.field_2._12_4_;
  if (this->m_numSamples != -1) {
    local_404 = this->m_numSamples;
  }
  funcSource.field_2._8_4_ = local_404;
  local_69 = 0;
  if ((this->m_checkAbsoluteValue & 1U) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &this->m_derivateFunc,"(value)");
  }
  else {
    std::operator+(&local_68,"abs(",&this->m_derivateFunc);
    local_69 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &local_68,"(value))");
  }
  if ((local_69 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_68);
  }
  pSVar3 = (ShaderProgram *)operator_new(0xd0);
  local_24a = 1;
  renderCtx_01 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_170);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,
             "#version 310 es\nin highp vec2 a_position;\nuniform highp float u_pointSize;\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tgl_PointSize = u_pointSize;\n}\n"
             ,&local_1b9);
  glu::VertexSource::VertexSource((VertexSource *)&local_198,&local_1b8);
  pPVar4 = glu::ProgramSources::operator<<(&local_170,&local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,
             "#version 310 es\nout mediump vec4 o_color;\nvoid main (void)\n{\n\thighp float value\t\t= gl_HelperInvocation ? 1.0 : 0.0;\n\thighp float derivate\t= "
             ,&local_249);
  std::operator+(&local_228,&local_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::operator+(&local_208,&local_228,
                 ";\n\tif (gl_HelperInvocation)\n\t\to_color = vec4(1.0, 0.0, derivate, 1.0);\n\telse\n\t\to_color = vec4(0.0, 1.0, derivate, 1.0);\n}\n"
                );
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_1e8,&local_208);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,&local_1e8);
  glu::ShaderProgram::ShaderProgram(pSVar3,renderCtx_01,pPVar4);
  local_24a = 0;
  de::DefaultDeleter<glu::ShaderProgram>::DefaultDeleter(&local_24b);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_a0);
  local_90 = de::details::MovePtr::operator_cast_to_PtrData(&local_a0,(MovePtr *)pSVar3);
  data._8_8_ = in_stack_fffffffffffffb90;
  data.ptr = in_stack_fffffffffffffb88;
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::operator=
            (&this->m_program,data);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_a0);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  glu::VertexSource::~VertexSource((VertexSource *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  glu::ProgramSources::~ProgramSources(&local_170);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pSVar3 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
           operator*(&(this->m_program).
                      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>)
  ;
  glu::operator<<(pTVar5,pSVar3);
  pSVar3 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
           operator->(&(this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                     );
  bVar1 = glu::ShaderProgram::isOk(pSVar3);
  if (bVar1) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_3d0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_3d0,(char (*) [33])"Using GL_RGBA8 framebuffer with ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)(funcSource.field_2._M_local_buf + 8));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])0x2c20441);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3d0);
    this_01 = (FboHelper *)operator_new(0x78);
    FboHelper::FboHelper(this_01,renderCtx_00,0x100,0x100,0x8058,funcSource.field_2._8_4_);
    de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>::DefaultDeleter
              (&local_3f1);
    pFVar7 = this_01;
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
    ::MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
               *)&local_3f0);
    local_3e0 = de::details::MovePtr::operator_cast_to_PtrData(&local_3f0,(MovePtr *)this_01);
    data_00._8_8_ = pMVar6;
    data_00.ptr = pFVar7;
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
    ::operator=(&this->m_fbo,data_00);
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
    ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
                *)&local_3f0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    iVar2 = std::__cxx11::string::~string((string *)local_48);
    return iVar2;
  }
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::clear
            (&this->m_program);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
             ,0x20d);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void HelperInvocationDerivateCase::init (void)
{
	const glu::RenderContext&	renderCtx		= m_context.getRenderContext();
	const glw::Functions&		gl				= renderCtx.getFunctions();
	const int					maxSamples		= getInteger(gl, GL_MAX_SAMPLES);
	const int					actualSamples	= m_numSamples == NUM_SAMPLES_MAX ? maxSamples : m_numSamples;
	const std::string			funcSource		= (m_checkAbsoluteValue) ? ("abs(" + m_derivateFunc + "(value))") : (m_derivateFunc + "(value)");

	m_program = MovePtr<ShaderProgram>(new ShaderProgram(m_context.getRenderContext(),
		glu::ProgramSources()
			<< glu::VertexSource(
				"#version 310 es\n"
				"in highp vec2 a_position;\n"
				"uniform highp float u_pointSize;\n"
				"void main (void)\n"
				"{\n"
				"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
				"	gl_PointSize = u_pointSize;\n"
				"}\n")
			<< glu::FragmentSource(string(
				"#version 310 es\n"
				"out mediump vec4 o_color;\n"
				"void main (void)\n"
				"{\n"
				"	highp float value		= gl_HelperInvocation ? 1.0 : 0.0;\n"
				"	highp float derivate	= ") + funcSource + ";\n"
				"	if (gl_HelperInvocation)\n"
				"		o_color = vec4(1.0, 0.0, derivate, 1.0);\n"
				"	else\n"
				"		o_color = vec4(0.0, 1.0, derivate, 1.0);\n"
				"}\n")));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		m_program.clear();
		TCU_FAIL("Compile failed");
	}

	m_testCtx.getLog() << TestLog::Message << "Using GL_RGBA8 framebuffer with "
					   << actualSamples << " samples" << TestLog::EndMessage;

	m_fbo = MovePtr<FboHelper>(new FboHelper(renderCtx, FRAMEBUFFER_WIDTH, FRAMEBUFFER_HEIGHT,
											 FRAMEBUFFER_FORMAT, actualSamples));

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}